

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprLoadDoclists(Fts3Cursor *pCsr,int *pnPhrase,int *pnToken)

{
  int iVar1;
  Fts3Cursor *local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_20 = pCsr;
  iVar1 = fts3ExprIterate(pCsr->pExpr,fts3ExprLoadDoclistsCb,&local_20);
  if (pnPhrase != (int *)0x0) {
    *pnPhrase = (int)local_18;
  }
  if (pnToken != (int *)0x0) {
    *pnToken = local_18._4_4_;
  }
  return iVar1;
}

Assistant:

static int fts3ExprLoadDoclists(
  Fts3Cursor *pCsr,               /* Fts3 cursor for current query */
  int *pnPhrase,                  /* OUT: Number of phrases in query */
  int *pnToken                    /* OUT: Number of tokens in query */
){
  int rc;                         /* Return Code */
  LoadDoclistCtx sCtx = {0,0,0};  /* Context for fts3ExprIterate() */
  sCtx.pCsr = pCsr;
  rc = fts3ExprIterate(pCsr->pExpr, fts3ExprLoadDoclistsCb, (void *)&sCtx);
  if( pnPhrase ) *pnPhrase = sCtx.nPhrase;
  if( pnToken ) *pnToken = sCtx.nToken;
  return rc;
}